

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_setup(sg_desc *desc)

{
  sg_desc local_128;
  sg_desc *local_10;
  sg_desc *desc_local;
  
  local_10 = desc;
  if (desc == (sg_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3d17,"void sg_setup(const sg_desc *)");
  }
  if ((desc->_start_canary == 0) && (desc->_end_canary == 0)) {
    if ((((desc->allocator).alloc == (_func_void_ptr_size_t_void_ptr *)0x0) ||
        ((desc->allocator).free == (_func_void_void_ptr_void_ptr *)0x0)) &&
       (((desc->allocator).alloc != (_func_void_ptr_size_t_void_ptr *)0x0 ||
        ((desc->allocator).free != (_func_void_void_ptr_void_ptr *)0x0)))) {
      __assert_fail("(desc->allocator.alloc && desc->allocator.free) || (!desc->allocator.alloc && !desc->allocator.free)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3d19,"void sg_setup(const sg_desc *)");
    }
    _sg_clear(&_sg,0x658);
    _sg_desc_defaults(&local_128,local_10);
    memcpy(&_sg.desc,&local_128,0x118);
    _sg_setup_pools(&_sg.pools,&_sg.desc);
    _sg_setup_commit_listeners(&_sg.desc);
    _sg.frame_index = 1;
    _sg_setup_backend(&_sg.desc);
    _sg.valid = true;
    sg_setup_context();
    return;
  }
  __assert_fail("(desc->_start_canary == 0) && (desc->_end_canary == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                ,0x3d18,"void sg_setup(const sg_desc *)");
}

Assistant:

inline void sg_setup(const sg_desc& desc) { return sg_setup(&desc); }